

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

GLuint gl4cts::CopyImage::Utils::getPixelSizeForFormat(GLenum internal_format)

{
  GLuint GVar1;
  TestError *this;
  
  GVar1 = 1;
  if ((int)internal_format < 0x8814) {
    switch(internal_format) {
    case 0x8229:
    case 0x8231:
    case 0x8232:
      break;
    case 0x822a:
    case 0x822b:
    case 0x822d:
    case 0x8233:
    case 0x8234:
    case 0x8237:
    case 0x8238:
switchD_0086d2ba_caseD_822a:
      GVar1 = 2;
      break;
    case 0x822c:
    case 0x822e:
    case 0x822f:
    case 0x8235:
    case 0x8236:
    case 0x8239:
    case 0x823a:
      goto switchD_0086d2ba_caseD_822c;
    case 0x8230:
    case 0x823b:
    case 0x823c:
switchD_0086d2ba_caseD_8229:
      return 8;
    default:
      switch(internal_format) {
      case 0x804f:
      case 0x8050:
      case 0x8055:
      case 0x8056:
      case 0x8057:
        goto switchD_0086d2ba_caseD_822a;
      case 0x8051:
        goto switchD_0086d2ba_caseD_8229;
      case 0x8052:
      case 0x8058:
      case 0x8059:
        goto switchD_0086d2ba_caseD_822c;
      case 0x8053:
      case 0x8054:
        goto switchD_0086d2ba_caseD_8229;
      case 0x805a:
      case 0x805b:
        goto switchD_0086d2ba_caseD_8229;
      default:
        if (internal_format == 0x2a10) {
          return 1;
        }
        goto switchD_0086d2e9_caseD_8d72;
      }
    }
  }
  else {
    if ((int)internal_format < 0x8d88) {
      if (0x8d6f < (int)internal_format) {
        switch(internal_format) {
        case 0x8d70:
        case 0x8d82:
          goto switchD_0086d2ba_caseD_8229;
        case 0x8d71:
        case 0x8d83:
          goto switchD_0086d2ba_caseD_8229;
        default:
          goto switchD_0086d2e9_caseD_8d72;
        case 0x8d76:
          goto switchD_0086d2ba_caseD_8229;
        case 0x8d77:
          goto switchD_0086d2ba_caseD_8229;
        case 0x8d7c:
          goto switchD_0086d2ba_caseD_822c;
        case 0x8d7d:
          goto switchD_0086d2ba_caseD_8229;
        }
      }
      switch(internal_format) {
      case 0x8814:
switchD_0086d2ba_caseD_8229:
        return 0x10;
      case 0x8815:
switchD_0086d2ba_caseD_8229:
        return 0xc;
      case 0x8816:
      case 0x8817:
      case 0x8818:
      case 0x8819:
switchD_0086d2e9_caseD_8d72:
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                   ,0x4bb);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      case 0x881a:
        goto switchD_0086d2ba_caseD_8229;
      case 0x881b:
        goto switchD_0086d2ba_caseD_8229;
      default:
        if ((internal_format != 0x8c3a) && (internal_format != 0x8c3d))
        goto switchD_0086d2e9_caseD_8d72;
      }
    }
    else {
      switch(internal_format) {
      case 0x8f94:
        goto switchD_0086d2ba_caseD_8229;
      case 0x8f95:
      case 0x8f98:
        goto switchD_0086d2ba_caseD_822a;
      case 0x8f96:
switchD_0086d2ba_caseD_8229:
        return 3;
      case 0x8f97:
      case 0x8f99:
        break;
      case 0x8f9a:
switchD_0086d2ba_caseD_8229:
        return 6;
      case 0x8f9b:
        goto switchD_0086d2ba_caseD_8229;
      default:
        switch(internal_format) {
        case 0x8d88:
          goto switchD_0086d2ba_caseD_8229;
        case 0x8d89:
          goto switchD_0086d2ba_caseD_8229;
        case 0x8d8a:
        case 0x8d8b:
        case 0x8d8c:
        case 0x8d8d:
          goto switchD_0086d2e9_caseD_8d72;
        case 0x8d8e:
          break;
        case 0x8d8f:
          goto switchD_0086d2ba_caseD_8229;
        default:
          if (internal_format != 0x906f) goto switchD_0086d2e9_caseD_8d72;
        }
      }
    }
switchD_0086d2ba_caseD_822c:
    GVar1 = 4;
  }
switchD_0086d2ba_caseD_8229:
  return GVar1;
}

Assistant:

GLuint Utils::getPixelSizeForFormat(GLenum internal_format)
{
	GLuint size = 0;

	switch (internal_format)
	{
	/* 8 */
	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	case GL_R8_SNORM:
	case GL_R3_G3_B2:
		size = 1;
		break;

	/* 8 */
	case GL_RGBA2:
		size = 2;
		break;

	/* 12 */
	case GL_RGB4:
		size = 2;
		break;

	/* 15 */
	case GL_RGB5:
		size = 2;
		break;

	/* 16 */
	case GL_RG8:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG8_SNORM:
	case GL_R16:
	case GL_R16F:
	case GL_R16I:
	case GL_R16UI:
	case GL_R16_SNORM:
	case GL_RGBA4:
	case GL_RGB5_A1:
		size = 2;
		break;

	/* 24 */
	case GL_RGB8:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_RGB8_SNORM:
		size = 3;
		break;

	/* 30 */
	case GL_RGB10:
		size = 4;
		break;

	/* 32 */
	case GL_RGBA8:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGBA8_SNORM:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG16_SNORM:
	case GL_R32F:
	case GL_R32I:
	case GL_R32UI:
	case GL_RGB10_A2:
	case GL_RGB10_A2UI:
	case GL_R11F_G11F_B10F:
	case GL_RGB9_E5:
		size = 4;
		break;

	/* 36 */
	case GL_RGB12:
		size = 6;
		break;

	/* 48 */
	case GL_RGB16:
	case GL_RGB16F:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB16_SNORM:
		size = 6;
		break;

	/* 64 */
	case GL_RGBA12:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA16_SNORM:
	case GL_RG32F:
	case GL_RG32I:
	case GL_RG32UI:
		size = 8;
		break;

	/* 96 */
	case GL_RGB32F:
	case GL_RGB32I:
	case GL_RGB32UI:
		size = 12;
		break;

	/* 128 */
	case GL_RGBA32F:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		size = 16;
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return size;
}